

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::find_eoi(jpeg_decoder *this)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  
  if (this->m_progressive_flag != 0) goto LAB_00121c4b;
  this->m_bits_left = 0;
  this->m_bit_buf = this->m_bit_buf << 0x10;
  iVar4 = this->m_in_buf_left;
  if (iVar4 == 0) {
    prep_in_buffer(this);
    iVar4 = this->m_in_buf_left;
    if (iVar4 != 0) goto LAB_00121ac0;
    uVar7 = this->m_tem_flag;
    this->m_tem_flag = uVar7 ^ 1;
    uVar6 = 0xd9;
    if (uVar7 == 0) {
      uVar6 = 0xff;
    }
LAB_00121b01:
    prep_in_buffer(this);
    iVar4 = this->m_in_buf_left;
    if (iVar4 != 0) {
      pbVar5 = this->m_pIn_buf_ofs;
      goto LAB_00121b1e;
    }
    uVar2 = this->m_tem_flag;
    this->m_tem_flag = uVar2 ^ 1;
    uVar7 = 0xd9;
    if (uVar2 == 0) {
      uVar7 = 0xff;
    }
    iVar4 = 0;
  }
  else {
LAB_00121ac0:
    pbVar3 = this->m_pIn_buf_ofs;
    pbVar5 = pbVar3 + 1;
    this->m_pIn_buf_ofs = pbVar5;
    uVar6 = (uint)*pbVar3;
    iVar4 = iVar4 + -1;
    this->m_in_buf_left = iVar4;
    if (iVar4 == 0) goto LAB_00121b01;
LAB_00121b1e:
    this->m_pIn_buf_ofs = pbVar5 + 1;
    uVar7 = (uint)*pbVar5;
    iVar4 = iVar4 + -1;
    this->m_in_buf_left = iVar4;
  }
  uVar7 = uVar6 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar7;
  if (this->m_bits_left < 1) {
    this->m_bit_buf = uVar7 << 0x10;
    if (iVar4 == 0) {
      prep_in_buffer(this);
      iVar4 = this->m_in_buf_left;
      if (iVar4 != 0) goto LAB_00121b80;
      uVar7 = this->m_tem_flag;
      this->m_tem_flag = uVar7 ^ 1;
      uVar6 = 0xd9;
      if (uVar7 == 0) {
        uVar6 = 0xff;
      }
LAB_00121be8:
      prep_in_buffer(this);
      iVar4 = this->m_in_buf_left;
      if (iVar4 != 0) {
        pbVar5 = this->m_pIn_buf_ofs;
        goto LAB_00121c01;
      }
      uVar2 = this->m_tem_flag;
      this->m_tem_flag = uVar2 ^ 1;
      uVar7 = 0xd9;
      if (uVar2 == 0) {
        uVar7 = 0xff;
      }
    }
    else {
LAB_00121b80:
      pbVar3 = this->m_pIn_buf_ofs;
      pbVar5 = pbVar3 + 1;
      this->m_pIn_buf_ofs = pbVar5;
      uVar6 = (uint)*pbVar3;
      iVar4 = iVar4 + -1;
      this->m_in_buf_left = iVar4;
      if (iVar4 == 0) goto LAB_00121be8;
LAB_00121c01:
      this->m_pIn_buf_ofs = pbVar5 + 1;
      bVar1 = *pbVar5;
      this->m_in_buf_left = iVar4 + -1;
      uVar7 = (uint)bVar1;
    }
    this->m_bit_buf =
         (uVar6 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar7) <<
         (-(char)this->m_bits_left & 0x1fU);
    this->m_bits_left = this->m_bits_left + 0x10;
  }
  else {
    this->m_bit_buf = (uVar7 << (-(char)this->m_bits_left & 0x1fU)) << 0x10;
  }
  process_markers(this);
LAB_00121c4b:
  this->m_total_bytes_read = this->m_total_bytes_read - this->m_in_buf_left;
  return;
}

Assistant:

void jpeg_decoder::find_eoi() {
  if (!m_progressive_flag) {
    // Attempt to read the EOI marker.
    //get_bits_no_markers(m_bits_left & 7);

    // Prime the bit buffer
    m_bits_left = 16;
    get_bits(16);
    get_bits(16);

    // The next marker _should_ be EOI
    process_markers();
  }

  m_total_bytes_read -= m_in_buf_left;
}